

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O2

int __thiscall
sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::connect
          (BasicSignal<int_(),_std::lock_guard<std::mutex>_> *this,int __fd,sockaddr *__addr,
          socklen_t __len)

{
  pthread_mutex_t *__mutex;
  undefined4 in_register_00000034;
  __shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2> local_78;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  sockaddr *local_38;
  
  __mutex = (pthread_mutex_t *)(CONCAT44(in_register_00000034,__fd) + 0x20);
  std::mutex::lock((mutex *)&__mutex->__data);
  makeConnection(this);
  std::__shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,(__shared_ptr<sigs::ConnectionBase,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_48 = local_78._M_ptr;
  p_Stack_40 = local_78._M_refcount._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = __addr;
  std::
  vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>
  ::emplace_back<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>
            ((vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>
              *)(CONCAT44(in_register_00000034,__fd) + 8),(Entry *)&local_68);
  Entry::~Entry((Entry *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  pthread_mutex_unlock(__mutex);
  return (int)this;
}

Assistant:

Connection connect(BasicSignal &signal) noexcept
  {
    Lock lock(entriesMutex);
    auto conn = makeConnection();
    entries.emplace_back(Entry(&signal, conn));
    return conn;
  }